

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O2

hrgls_Status
hrgls_DataBlobSourceSetStreamCallback
          (hrgls_DataBlobSource stream,hrgls_DataBlobSourceCallback handler,void *userData)

{
  hrgls_Status hVar1;
  
  if (stream != (hrgls_DataBlobSource)0x0) {
    stream->CHandler = handler;
    stream->CUserData = userData;
    if (handler == (hrgls_DataBlobSourceCallback)0x0) {
      hVar1 = hrgls::datablob::DataBlobSource::SetStreamCallback
                        (stream->stream,(StreamCallback)0x0,(void *)0x0);
    }
    else {
      hVar1 = hrgls::datablob::DataBlobSource::SetStreamCallback
                        (stream->stream,DataBlobSourceCallback,stream);
    }
    return hVar1;
  }
  return 0x3ee;
}

Assistant:

hrgls_Status hrgls_DataBlobSourceSetStreamCallback(hrgls_DataBlobSource stream,
    hrgls_DataBlobSourceCallback handler, void *userData)
  {
    if (!stream) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    stream->CHandler = handler;
    stream->CUserData = userData;
    try {
      // If we are supposed to be calling a callback handler, then set our callback handler
      // as the intercept.  If not, then set it to nullptr so that no callbacks are called.
      if (!handler) {
        return stream->stream->SetStreamCallback(nullptr, nullptr);
      }
      return stream->stream->SetStreamCallback(DataBlobSourceCallback, stream);
    }
    catch (...) {
      return hrgls_STATUS_INTERNAL_EXCEPTION;
    }
  }